

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::
PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
::~PairMatcher(PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
               *this)

{
  PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
  *this_local;
  
  ~PairMatcher(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

class PairMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    PairMatcher(const T1& m1, const T2& m2) : m_m1(m1), m_m2(m2) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if IUTEST_COND_UNLIKELY( !CheckElem(actual.first, m_m1) )
        {
            return AssertionFailure() << WhichIs();
        }
        if IUTEST_COND_UNLIKELY( !CheckElem(actual.second, m_m2) )
        {
            return AssertionFailure() << WhichIs();
        }
        return AssertionSuccess();
    }